

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFocusScope(ImGuiID id)

{
  int *piVar1;
  uint *puVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  iVar4 = (GImGui->FocusScopeStack).Size;
  if (iVar4 == (GImGui->FocusScopeStack).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
    puVar2 = (pIVar3->FocusScopeStack).Data;
    if (puVar2 != (uint *)0x0) {
      memcpy(__dest,puVar2,(long)(pIVar3->FocusScopeStack).Size << 2);
      puVar2 = (pIVar3->FocusScopeStack).Data;
      if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    }
    (pIVar3->FocusScopeStack).Data = __dest;
    (pIVar3->FocusScopeStack).Capacity = iVar6;
    iVar4 = (pIVar3->FocusScopeStack).Size;
  }
  else {
    __dest = (GImGui->FocusScopeStack).Data;
  }
  __dest[iVar4] = id;
  (pIVar3->FocusScopeStack).Size = (pIVar3->FocusScopeStack).Size + 1;
  pIVar3->CurrentFocusScopeId = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    g.FocusScopeStack.push_back(id);
    g.CurrentFocusScopeId = id;
}